

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskUtil.cpp
# Opt level: O0

Sector * GetTypicalSector(Sector *__return_storage_ptr__,CylHead *cylhead,Track *track,Sector *last)

{
  int iVar1;
  bool bVar2;
  reference __k;
  mapped_type *pmVar3;
  Sector *sector;
  const_iterator __end1;
  const_iterator __begin1;
  Track *__range1;
  undefined1 local_148 [8];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> gap3s;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> sizes;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> heads;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> cyls;
  map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
  encodings;
  map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
  datarates;
  Sector *last_local;
  Track *track_local;
  CylHead *cylhead_local;
  Sector *typical;
  
  std::map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>::
  map((map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_> *)
      &encodings._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>::
  map((map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_> *)
      &cyls._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &heads._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &sizes._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &gap3s._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)local_148
            );
  Sector::Sector(__return_storage_ptr__,last);
  __end1 = Track::begin(track);
  sector = (Sector *)Track::end(track);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>
                                     *)&sector), bVar2) {
    __k = __gnu_cxx::
          __normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
          operator*(&__end1);
    pmVar3 = std::
             map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
             ::operator[]((map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
                           *)&encodings._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          &__k->datarate);
    iVar1 = *pmVar3;
    *pmVar3 = iVar1 + 1;
    pmVar3 = std::
             map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
             ::operator[]((map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
                           *)&encodings._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          &__return_storage_ptr__->datarate);
    if (*pmVar3 < iVar1 + 1) {
      __return_storage_ptr__->datarate = __k->datarate;
    }
    pmVar3 = std::
             map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
             ::operator[]((map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
                           *)&cyls._M_t._M_impl.super__Rb_tree_header._M_node_count,&__k->encoding);
    iVar1 = *pmVar3;
    *pmVar3 = iVar1 + 1;
    pmVar3 = std::
             map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
             ::operator[]((map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
                           *)&cyls._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          &__return_storage_ptr__->encoding);
    if (*pmVar3 < iVar1 + 1) {
      __return_storage_ptr__->encoding = __k->encoding;
    }
    pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&heads._M_t._M_impl.super__Rb_tree_header._M_node_count,(key_type *)__k);
    iVar1 = *pmVar3;
    *pmVar3 = iVar1 + 1;
    pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&heads._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (key_type *)__return_storage_ptr__);
    if (*pmVar3 < iVar1 + 1) {
      (__return_storage_ptr__->header).cyl = (__k->header).cyl;
    }
    pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&sizes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &(__k->header).head);
    iVar1 = *pmVar3;
    *pmVar3 = iVar1 + 1;
    pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&sizes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &(__return_storage_ptr__->header).head);
    if (*pmVar3 < iVar1 + 1) {
      (__return_storage_ptr__->header).head = (__k->header).head;
    }
    pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&gap3s._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &(__k->header).size);
    iVar1 = *pmVar3;
    *pmVar3 = iVar1 + 1;
    pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&gap3s._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &(__return_storage_ptr__->header).size);
    if (*pmVar3 < iVar1 + 1) {
      (__return_storage_ptr__->header).size = (__k->header).size;
    }
    pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)local_148,&__k->gap3);
    iVar1 = *pmVar3;
    *pmVar3 = iVar1 + 1;
    pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)local_148,&__return_storage_ptr__->gap3);
    if (*pmVar3 < iVar1 + 1) {
      __return_storage_ptr__->gap3 = __k->gap3;
    }
    __gnu_cxx::__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
    operator++(&__end1);
  }
  pmVar3 = std::
           map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
           ::operator[]((map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
                         *)&encodings._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &__return_storage_ptr__->datarate);
  iVar1 = *pmVar3;
  pmVar3 = std::
           map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
           ::operator[]((map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>
                         *)&encodings._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &last->datarate);
  if (iVar1 == *pmVar3) {
    __return_storage_ptr__->datarate = last->datarate;
  }
  pmVar3 = std::
           map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
           ::operator[]((map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
                         *)&cyls._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &__return_storage_ptr__->encoding);
  iVar1 = *pmVar3;
  pmVar3 = std::
           map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
           ::operator[]((map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>
                         *)&cyls._M_t._M_impl.super__Rb_tree_header._M_node_count,&last->encoding);
  if (iVar1 == *pmVar3) {
    __return_storage_ptr__->encoding = last->encoding;
  }
  pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &heads._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      (key_type *)__return_storage_ptr__);
  iVar1 = *pmVar3;
  pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &heads._M_t._M_impl.super__Rb_tree_header._M_node_count,&cylhead->cyl);
  if (iVar1 == *pmVar3) {
    (__return_storage_ptr__->header).cyl = cylhead->cyl;
  }
  else {
    pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&heads._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (key_type *)__return_storage_ptr__);
    iVar1 = *pmVar3;
    pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&heads._M_t._M_impl.super__Rb_tree_header._M_node_count,(key_type *)last)
    ;
    if (iVar1 == *pmVar3) {
      (__return_storage_ptr__->header).cyl = (last->header).cyl;
    }
    else {
      pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&heads._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          (key_type *)__return_storage_ptr__);
      if (*pmVar3 == 1) {
        (__return_storage_ptr__->header).cyl = cylhead->cyl;
      }
    }
  }
  pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &sizes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      &(__return_storage_ptr__->header).head);
  iVar1 = *pmVar3;
  pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &sizes._M_t._M_impl.super__Rb_tree_header._M_node_count,&cylhead->head);
  if (iVar1 == *pmVar3) {
    (__return_storage_ptr__->header).head = cylhead->head;
  }
  else {
    pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&sizes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &(__return_storage_ptr__->header).head);
    iVar1 = *pmVar3;
    pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&sizes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        &(last->header).head);
    if (iVar1 == *pmVar3) {
      (__return_storage_ptr__->header).head = (last->header).head;
    }
    else {
      pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&sizes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          &(__return_storage_ptr__->header).head);
      if (*pmVar3 == 1) {
        (__return_storage_ptr__->header).head = cylhead->head;
      }
    }
  }
  pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &gap3s._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      &(__return_storage_ptr__->header).size);
  iVar1 = *pmVar3;
  pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &gap3s._M_t._M_impl.super__Rb_tree_header._M_node_count,&(last->header).size);
  if (iVar1 == *pmVar3) {
    (__return_storage_ptr__->header).size = (last->header).size;
  }
  if ((last->gap3 != 0) &&
     ((pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)local_148,&last->gap3), *pmVar3 != 0 ||
      (__return_storage_ptr__->gap3 == 0)))) {
    __return_storage_ptr__->gap3 = last->gap3;
  }
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)local_148
            );
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &gap3s._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &sizes._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &heads._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_>::
  ~map((map<Encoding,_int,_std::less<Encoding>,_std::allocator<std::pair<const_Encoding,_int>_>_> *)
       &cyls._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_>::
  ~map((map<DataRate,_int,_std::less<DataRate>,_std::allocator<std::pair<const_DataRate,_int>_>_> *)
       &encodings._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return __return_storage_ptr__;
}

Assistant:

Sector GetTypicalSector(const CylHead& cylhead, const Track& track, const Sector& last)
{
    std::map<DataRate, int> datarates;
    std::map<Encoding, int> encodings;
    std::map<int, int> cyls, heads, sizes, gap3s;

    Sector typical = last;

    // Find the most common values
    for (const auto& sector : track)
    {
        if (++datarates[sector.datarate] > datarates[typical.datarate])
            typical.datarate = sector.datarate;

        if (++encodings[sector.encoding] > encodings[typical.encoding])
            typical.encoding = sector.encoding;

        if (++cyls[sector.header.cyl] > cyls[typical.header.cyl])
            typical.header.cyl = sector.header.cyl;

        if (++heads[sector.header.head] > heads[typical.header.head])
            typical.header.head = sector.header.head;

        if (++sizes[sector.header.size] > sizes[typical.header.size])
            typical.header.size = sector.header.size;

        if (++gap3s[sector.gap3] > gap3s[typical.gap3])
            typical.gap3 = sector.gap3;
    }

    // Use the previous values if the typical values are no better,
    // except for cyl and head where we favour the physical position
    // and prevent a single different sector changing the values.

    if (datarates[typical.datarate] == datarates[last.datarate])
        typical.datarate = last.datarate;

    if (encodings[typical.encoding] == encodings[last.encoding])
        typical.encoding = last.encoding;

    if (cyls[typical.header.cyl] == cyls[cylhead.cyl])
        typical.header.cyl = cylhead.cyl;
    else if (cyls[typical.header.cyl] == cyls[last.header.cyl])
        typical.header.cyl = last.header.cyl;
    else if (cyls[typical.header.cyl] == 1)
        typical.header.cyl = cylhead.cyl;

    if (heads[typical.header.head] == heads[cylhead.head])
        typical.header.head = cylhead.head;
    else if (heads[typical.header.head] == heads[last.header.head])
        typical.header.head = last.header.head;
    else if (heads[typical.header.head] == 1)
        typical.header.head = cylhead.head;

    if (sizes[typical.header.size] == sizes[last.header.size])
        typical.header.size = last.header.size;

    // Use previous gap3 if still present, or if no new gap3 was found.
    if (last.gap3 && (gap3s[last.gap3] || !typical.gap3))
        typical.gap3 = last.gap3;

    return typical;
}